

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_remove(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  
  if (idx < 1) {
    pTVar1 = L->top;
    pTVar2 = pTVar1 + idx;
  }
  else {
    pTVar1 = L->top;
    pTVar2 = L->base + ((ulong)(uint)idx - 1);
    if (pTVar1 <= pTVar2) {
      pTVar2 = (TValue *)((L->glref).ptr64 + 0xf8);
    }
  }
  while (pTVar3 = pTVar2 + 1, pTVar3 < pTVar1) {
    *pTVar2 = *pTVar3;
    pTVar2 = pTVar3;
    pTVar1 = L->top;
  }
  L->top = pTVar1 + -1;
  return;
}

Assistant:

static TValue *index2adr_stack(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    if (o < L->top) {
      return o;
    } else {
      lj_checkapi(0, "invalid stack slot %d", idx);
      return niltv(L);
    }
    return o < L->top ? o : niltv(L);
  } else {
    lj_checkapi(idx != 0 && -idx <= L->top - L->base,
		"invalid stack slot %d", idx);
    return L->top + idx;
  }
}